

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedCombinedCase::init
          (ComputeShaderGeneratedCombinedCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  ShaderProgram *pSVar3;
  RenderContext *renderCtx;
  ProgramSources *sources;
  TestLog *log;
  TestError *this_00;
  allocator<char> local_161;
  string local_160;
  undefined1 local_139;
  string local_138;
  ShaderSource local_118;
  ProgramSources local_e0;
  ComputeShaderGeneratedCombinedCase *local_10;
  ComputeShaderGeneratedCombinedCase *this_local;
  
  local_10 = this;
  pSVar3 = (ShaderProgram *)operator_new(0xd0);
  local_139 = 1;
  renderCtx = Context::getRenderContext
                        ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_e0);
  (anonymous_namespace)::ComputeShaderGeneratedCase::genComputeSource_abi_cxx11_
            (&local_138,this,(bool)((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1),
             (bool)((this->super_ComputeShaderGeneratedCase).m_computeData & 1),
             (bool)((this->super_ComputeShaderGeneratedCase).m_computeIndices & 1));
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_118,&local_138);
  sources = glu::ProgramSources::operator<<(&local_e0,&local_118);
  glu::ShaderProgram::ShaderProgram(pSVar3,renderCtx,sources);
  local_139 = 0;
  this->m_computeProgram = pSVar3;
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  glu::ProgramSources::~ProgramSources(&local_e0);
  log = tcu::TestContext::getLog
                  ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                   super_TestNode.m_testCtx);
  pSVar3 = this->m_computeProgram;
  glu::operator<<(log,pSVar3);
  bVar1 = glu::ShaderProgram::isOk(this->m_computeProgram);
  if (!bVar1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"Failed to compile compute shader.",&local_161);
    tcu::TestError::TestError(this_00,&local_160);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar2 = ComputeShaderGeneratedCase::init
                    (&this->super_ComputeShaderGeneratedCase,(EVP_PKEY_CTX *)pSVar3);
  return iVar2;
}

Assistant:

void ComputeShaderGeneratedCombinedCase::init (void)
{
	// generate compute shader

	m_computeProgram = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genComputeSource(m_computeCmd, m_computeData, m_computeIndices)));
	m_testCtx.getLog() << *m_computeProgram;

	if (!m_computeProgram->isOk())
		throw tcu::TestError("Failed to compile compute shader.");

	// init parent
	ComputeShaderGeneratedCase::init();
}